

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

string * __thiscall
t_php_generator::type_to_cast_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_type *type)

{
  int iVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[5])(type);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(type->super_t_doc)._vptr_t_doc[10])(type);
    if ((char)iVar1 == '\0') {
      pcVar3 = "";
      paVar2 = &local_17;
    }
    else {
      pcVar3 = "(int)";
      paVar2 = &local_16;
    }
  }
  else {
    switch(*(undefined4 *)&type[1].super_t_doc._vptr_t_doc) {
    case 1:
      pcVar3 = "(string)";
      paVar2 = &local_14;
      break;
    case 2:
      pcVar3 = "(bool)";
      paVar2 = &local_11;
      break;
    case 3:
    case 4:
    case 5:
    case 6:
      pcVar3 = "(int)";
      paVar2 = &local_12;
      break;
    case 7:
      pcVar3 = "(double)";
      paVar2 = &local_13;
      break;
    default:
      pcVar3 = "";
      paVar2 = &local_15;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

string t_php_generator::type_to_cast(t_type* type) {
  if (type->is_base_type()) {
    t_base_type* btype = (t_base_type*)type;
    switch (btype->get_base()) {
    case t_base_type::TYPE_BOOL:
      return "(bool)";
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      return "(int)";
    case t_base_type::TYPE_DOUBLE:
      return "(double)";
    case t_base_type::TYPE_STRING:
      return "(string)";
    default:
      return "";
    }
  } else if (type->is_enum()) {
    return "(int)";
  }
  return "";
}